

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall doctest::detail::ResultBuilder::translateException(ResultBuilder *this)

{
  String *pSVar1;
  char *pcVar2;
  undefined1 local_30;
  undefined7 uStack_2f;
  undefined8 uStack_28;
  undefined7 local_20;
  char cStack_19;
  
  (this->super_AssertData).m_threw = true;
  anon_unknown_15::translateActiveException();
  pSVar1 = &(this->super_AssertData).m_exception;
  if (pSVar1 != (String *)&local_30) {
    if (((this->super_AssertData).m_exception.field_0.buf[0x17] < '\0') &&
       (pcVar2 = (pSVar1->field_0).data.ptr, pcVar2 != (char *)0x0)) {
      operator_delete__(pcVar2);
    }
    *(ulong *)((long)&(this->super_AssertData).m_exception.field_0 + 0x10) =
         CONCAT17(cStack_19,local_20);
    (pSVar1->field_0).data.ptr = (char *)CONCAT71(uStack_2f,local_30);
    *(undefined8 *)((long)&(this->super_AssertData).m_exception.field_0 + 8) = uStack_28;
    local_30 = 0;
    cStack_19 = '\x17';
  }
  if ((cStack_19 < '\0') && ((void *)CONCAT71(uStack_2f,local_30) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(uStack_2f,local_30));
  }
  return;
}

Assistant:

void ResultBuilder::translateException() {
        m_threw     = true;
        m_exception = translateActiveException();
    }